

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport_p.h
# Opt level: O0

void __thiscall KDReports::HeaderMap::layoutWithTextWidth(HeaderMap *this,qreal w)

{
  bool bVar1;
  Header **ppHVar2;
  TextDocument *this_00;
  const_iterator local_28;
  const_iterator local_20;
  const_iterator it;
  qreal w_local;
  HeaderMap *this_local;
  
  it.i._M_node = (const_iterator)(const_iterator)w;
  local_20._M_node =
       (_Base_ptr)
       QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::constBegin
                 (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::constEnd
                   (&this->super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>);
    bVar1 = ::operator!=((const_iterator *)&local_20,(const_iterator *)&local_28);
    if (!bVar1) break;
    ppHVar2 = QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::const_iterator::value
                        ((const_iterator *)&local_20);
    this_00 = Header::doc(*ppHVar2);
    TextDocument::layoutWithTextWidth(this_00,(qreal)it.i._M_node);
    QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::const_iterator::operator++
              ((const_iterator *)&local_20);
  }
  return;
}

Assistant:

void layoutWithTextWidth(qreal w)
    {
        for (const_iterator it = constBegin(); it != constEnd(); ++it) {
            it.value()->doc().layoutWithTextWidth(w);
        }
    }